

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall EthUdpPort::SetMulticastIP(EthUdpPort *this,string *multicast)

{
  bool ret;
  string *multicast_local;
  EthUdpPort *this_local;
  
  if (this->sockPtr == (SocketInternals *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = SocketInternals::SetMulticastIP(this->sockPtr,multicast);
    if (this_local._7_1_) {
      std::__cxx11::string::operator=((string *)&this->MulticastIP,(string *)multicast);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool EthUdpPort::SetMulticastIP(const std::string &multicast)
{
    if (!sockPtr)
        return false;
    bool ret = sockPtr->SetMulticastIP(multicast);
    if (ret)
        MulticastIP = multicast;
    return ret;
}